

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::
Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doPrintExpr(Apply<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_2,_3>,_tcu::Vector<float,_2>,_tcu::Vector<float,_3>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
              *this,ostream *os)

{
  BaseArgExprs args;
  ExprBase *local_30;
  _Vector_base<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
  local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30 = &((this->m_args).a.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
               super_ExprPBase<tcu::Vector<float,_2>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>
              .m_ptr)->super_ExprBase;
  std::
  vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
  ::emplace_back<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>
            ((vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).b.super_ContainerExprPBase<tcu::Vector<float,_3>_>.
               super_ExprPBase<tcu::Vector<float,_3>_>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_3>_>_>
              .m_ptr)->super_ExprBase;
  std::
  vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
  ::emplace_back<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>
            ((vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).c.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_ptr)->super_ExprBase;
  std::
  vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
  ::emplace_back<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>
            ((vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
              *)&local_28,&local_30);
  local_30 = &((this->m_args).d.super_ContainerExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_ExprPBase<deqp::gls::BuiltinPrecisionTests::Void>.
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<deqp::gls::BuiltinPrecisionTests::Void>_>
              .m_ptr)->super_ExprBase;
  std::
  vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
  ::emplace_back<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>
            ((vector<deqp::gls::BuiltinPrecisionTests::ExprBase_const*,std::allocator<deqp::gls::BuiltinPrecisionTests::ExprBase_const*>>
              *)&local_28,&local_30);
  (**(code **)(*(long *)this->m_func + 0x20))(this->m_func,os,&local_28);
  std::
  _Vector_base<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::ExprBase_*>_>
  ::~_Vector_base(&local_28);
  return;
}

Assistant:

void				doPrintExpr			(ostream& os) const
	{
		BaseArgExprs	args;
		args.push_back(m_args.a.get());
		args.push_back(m_args.b.get());
		args.push_back(m_args.c.get());
		args.push_back(m_args.d.get());
		m_func.print(os, args);
	}